

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void validateWorld(World *world)

{
  bool bVar1;
  Type TVar2;
  ViewPlane *this;
  SamplerState *this_00;
  Sampler *pSVar3;
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  *this_01;
  reference this_02;
  pointer this_03;
  Material *pMVar4;
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  *this_04;
  reference this_05;
  pointer pMVar5;
  Matte *this_06;
  Lambertian *pLVar6;
  Phong *this_07;
  GlossySpecular *this_08;
  Phong *phong;
  Matte *matte;
  unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *material;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
  *__range1_1;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *object;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
  *__range1;
  World *world_local;
  
  this = pm::World::viewPlane(world);
  this_00 = pm::ViewPlane::samplerState(this);
  pSVar3 = pm::SamplerState::sampler(this_00);
  if (pSVar3 == (Sampler *)0x0) {
    std::operator<<((ostream *)&std::cout,"Missing viewplane sampler!\n");
    exit(1);
  }
  this_01 = pm::World::objects(world);
  __end1 = std::
           vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
           ::begin(this_01);
  object = (unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)
           std::
           vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>
           ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_*,_std::vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>_>
                                     *)&object), bVar1) {
    this_02 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_*,_std::vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>_>
              ::operator*(&__end1);
    this_03 = std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::operator->(this_02)
    ;
    pMVar4 = pm::Geometry::material(this_03);
    if (pMVar4 == (Material *)0x0) {
      std::operator<<((ostream *)&std::cout,"Missing material!\n");
      exit(1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_*,_std::vector<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>,_std::allocator<std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>_>_>_>
    ::operator++(&__end1);
  }
  this_04 = pm::World::materials(world);
  __end1_1 = std::
             vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
             ::begin(this_04);
  material = (unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)
             std::
             vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
             ::end(this_04);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_*,_std::vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>_>
                        *)&material);
    if (!bVar1) {
      return;
    }
    this_05 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_*,_std::vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>_>
              ::operator*(&__end1_1);
    pMVar5 = std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::operator->(this_05);
    TVar2 = pm::Material::type(pMVar5);
    if (TVar2 == MATTE) {
      this_06 = (Matte *)std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::get
                                   (this_05);
      pLVar6 = pm::Matte::ambient(this_06);
      pSVar3 = pm::BRDF::sampler(&pLVar6->super_BRDF);
      if (pSVar3 == (Sampler *)0x0) {
        std::operator<<((ostream *)&std::cout,"Missing ambient sampler from matte material!\n");
        exit(1);
      }
      pLVar6 = pm::Matte::diffuse(this_06);
      pSVar3 = pm::BRDF::sampler(&pLVar6->super_BRDF);
      if (pSVar3 == (Sampler *)0x0) {
        std::operator<<((ostream *)&std::cout,"Missing diffuse sampler from matte material!\n");
        exit(1);
      }
    }
    else {
      pMVar5 = std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::operator->
                         (this_05);
      TVar2 = pm::Material::type(pMVar5);
      if (TVar2 == PHONG) {
        this_07 = (Phong *)std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>::get
                                     (this_05);
        pLVar6 = pm::Phong::ambient(this_07);
        pSVar3 = pm::BRDF::sampler(&pLVar6->super_BRDF);
        if (pSVar3 == (Sampler *)0x0) {
          std::operator<<((ostream *)&std::cout,"Missing ambient sampler from phong material!\n");
          exit(1);
        }
        pLVar6 = pm::Phong::diffuse(this_07);
        pSVar3 = pm::BRDF::sampler(&pLVar6->super_BRDF);
        if (pSVar3 == (Sampler *)0x0) {
          std::operator<<((ostream *)&std::cout,"Missing diffuse sampler from phong material!\n");
          exit(1);
        }
        this_08 = pm::Phong::specular(this_07);
        pSVar3 = pm::BRDF::sampler(&this_08->super_BRDF);
        if (pSVar3 == (Sampler *)0x0) {
          std::operator<<((ostream *)&std::cout,"Missing specular sampler from phong material!\n");
          exit(1);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_*,_std::vector<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void validateWorld(const pm::World &world)
{
	if (world.viewPlane().samplerState().sampler() == nullptr)
	{
		std::cout << "Missing viewplane sampler!\n";
		exit(EXIT_FAILURE);
	}

	for (const auto &object : world.objects())
	{
		if (object->material() == nullptr)
		{
			std::cout << "Missing material!\n";
			exit(EXIT_FAILURE);
		}
	}

	for (const auto &material : world.materials())
	{
		if (material->type() == pm::Material::Type::MATTE)
		{
			const pm::Matte *matte = static_cast<pm::Matte *>(material.get());
			if (matte->ambient().sampler() == nullptr)
			{
				std::cout << "Missing ambient sampler from matte material!\n";
				exit(EXIT_FAILURE);
			}
			else if (matte->diffuse().sampler() == nullptr)
			{
				std::cout << "Missing diffuse sampler from matte material!\n";
				exit(EXIT_FAILURE);
			}
		}
		else if (material->type() == pm::Material::Type::PHONG)
		{
			const pm::Phong *phong = static_cast<pm::Phong *>(material.get());
			if (phong->ambient().sampler() == nullptr)
			{
				std::cout << "Missing ambient sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
			else if (phong->diffuse().sampler() == nullptr)
			{
				std::cout << "Missing diffuse sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
			else if (phong->specular().sampler() == nullptr)
			{
				std::cout << "Missing specular sampler from phong material!\n";
				exit(EXIT_FAILURE);
			}
		}
	}
}